

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int FinalizeTokenProbas(VP8EncProba *proba)

{
  byte bVar1;
  byte bVar2;
  StatsArray (*paaapVar3) [8];
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ProbaArray (*paaauVar8) [8];
  ProbaArray (*paaauVar9) [8];
  int iVar10;
  StatsArray (*paaapVar11) [8];
  StatsArray (*paaapVar12) [8];
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint8_t (*paaauVar17) [8] [3] [11];
  uint8_t (*pauVar18) [11];
  uint8_t (*paaauVar19) [8] [3] [11];
  uint8_t (*pauVar20) [11];
  uint8_t (*pauVar21) [11];
  long lVar22;
  uint local_a4;
  ProbaArray (*local_a0) [8];
  uint8_t (*local_98) [11];
  
  paaapVar3 = proba->stats_;
  paaauVar8 = proba->coeffs_;
  lVar13 = 0;
  paaauVar19 = VP8CoeffsUpdateProba;
  paaauVar17 = VP8CoeffsProba0;
  local_a4 = 0;
  iVar6 = 0;
  do {
    lVar5 = 0;
    paaauVar9 = paaauVar8;
    paaapVar11 = paaapVar3;
    pauVar18 = (uint8_t (*) [11])paaauVar17;
    pauVar20 = (uint8_t (*) [11])paaauVar19;
    do {
      lVar4 = 0;
      paaapVar12 = paaapVar11;
      pauVar21 = pauVar20;
      local_a0 = paaauVar9;
      local_98 = pauVar18;
      do {
        lVar22 = 0;
        do {
          uVar14 = (*paaapVar12)[0][0][lVar22];
          uVar15 = uVar14 >> 0x10;
          bVar1 = (*(uint8_t (*) [3] [11])*pauVar21)[0][lVar22];
          bVar2 = (*(uint8_t (*) [3] [11])*local_98)[0][lVar22];
          uVar14 = uVar14 & 0xffff;
          if (uVar14 == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = 0xff - (uVar14 * 0xff) / uVar15;
          }
          iVar16 = uVar15 - uVar14;
          iVar10 = (uint)VP8EntropyCost[bVar1] + (uint)VP8EntropyCost[bVar2] * iVar16 +
                   VP8EntropyCost[bVar2 ^ 0xff] * uVar14;
          iVar16 = (uint)VP8EntropyCost[(byte)~bVar1] +
                   (uint)VP8EntropyCost[uVar7 & 0xff] * iVar16 +
                   VP8EntropyCost[uVar7 & 0xff ^ 0xff] * uVar14 + 0x800;
          iVar6 = iVar6 + (uint)VP8EntropyCost[(byte)(-(iVar16 < iVar10) ^ bVar1)];
          if (iVar16 < iVar10) {
            (*local_a0)[0][0][lVar22] = (uint8_t)uVar7;
            local_a4 = local_a4 | uVar7 != bVar2;
            iVar6 = iVar6 + 0x800;
          }
          else {
            (*local_a0)[0][0][lVar22] = bVar2;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0xb);
        lVar4 = lVar4 + 1;
        paaapVar12 = (StatsArray (*) [8])((*paaapVar12)[0] + 1);
        pauVar21 = pauVar21 + 1;
        local_98 = local_98 + 1;
        local_a0 = (ProbaArray (*) [8])((*local_a0)[0] + 1);
      } while (lVar4 != 3);
      lVar5 = lVar5 + 1;
      paaapVar11 = (StatsArray (*) [8])(*paaapVar11 + 1);
      pauVar20 = pauVar20 + 3;
      pauVar18 = pauVar18 + 3;
      paaauVar9 = (ProbaArray (*) [8])(*paaauVar9 + 1);
    } while (lVar5 != 8);
    lVar13 = lVar13 + 1;
    paaapVar3 = paaapVar3 + 1;
    paaauVar19 = (uint8_t (*) [8] [3] [11])((long)paaauVar19 + 0x108);
    paaauVar17 = (uint8_t (*) [8] [3] [11])((long)paaauVar17 + 0x108);
    paaauVar8 = paaauVar8 + 1;
  } while (lVar13 != 4);
  proba->dirty_ = local_a4;
  return iVar6;
}

Assistant:

static int FinalizeTokenProbas(VP8EncProba* const proba) {
  int has_changed = 0;
  int size = 0;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const proba_t stats = proba->stats_[t][b][c][p];
          const int nb = (stats >> 0) & 0xffff;
          const int total = (stats >> 16) & 0xffff;
          const int update_proba = VP8CoeffsUpdateProba[t][b][c][p];
          const int old_p = VP8CoeffsProba0[t][b][c][p];
          const int new_p = CalcTokenProba(nb, total);
          const int old_cost = BranchCost(nb, total, old_p)
                             + VP8BitCost(0, update_proba);
          const int new_cost = BranchCost(nb, total, new_p)
                             + VP8BitCost(1, update_proba)
                             + 8 * 256;
          const int use_new_p = (old_cost > new_cost);
          size += VP8BitCost(use_new_p, update_proba);
          if (use_new_p) {  // only use proba that seem meaningful enough.
            proba->coeffs_[t][b][c][p] = new_p;
            has_changed |= (new_p != old_p);
            size += 8 * 256;
          } else {
            proba->coeffs_[t][b][c][p] = old_p;
          }
        }
      }
    }
  }
  proba->dirty_ = has_changed;
  return size;
}